

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O3

int coda_ascii_cursor_set_asciilines(coda_cursor_conflict *cursor,coda_product *product)

{
  int iVar1;
  int iVar2;
  coda_type_array *type;
  coda_type_array *type_00;
  
  if ((product[1].root_type == (coda_dynamic_type *)0x0) &&
     (iVar1 = coda_ascii_init_asciilines(product), iVar1 != 0)) {
    return -1;
  }
  type = (coda_type_array *)product[1].product_variable_size;
  if (type == (coda_type_array *)0x0) {
    type = coda_type_array_new(coda_format_ascii);
    iVar1 = -1;
    if (type == (coda_type_array *)0x0) {
      return -1;
    }
    iVar2 = coda_type_array_add_fixed_dimension(type,*(long *)&product[1].format);
    if ((iVar2 == 0) &&
       (type_00 = (coda_type_array *)coda_type_text_new(coda_format_ascii),
       type_00 != (coda_type_array *)0x0)) {
      coda_type_text_set_special_text_type((coda_type_text *)type_00,ascii_text_line_with_eol);
      iVar2 = coda_type_array_set_base_type(type,(coda_type *)type_00);
      if (iVar2 == 0) {
        product[1].product_variable_size = (long *)type;
        goto LAB_0014e2fe;
      }
      coda_type_release((coda_type *)type);
      type = type_00;
    }
    coda_type_release((coda_type *)type);
  }
  else {
LAB_0014e2fe:
    cursor->product = product;
    cursor->n = 1;
    cursor->stack[0].type = (coda_dynamic_type_struct *)type;
    cursor->stack[0].index = -1;
    cursor->stack[0].bit_offset = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int coda_ascii_cursor_set_asciilines(coda_cursor *cursor, coda_product *product)
{
    coda_ascii_product *product_file = (coda_ascii_product *)product;

    if (product_file->asciiline_end_offset == NULL)
    {
        if (coda_ascii_init_asciilines(product) != 0)
        {
            return -1;
        }
    }

    if (product_file->asciilines == NULL)
    {
        coda_type_array *array;
        coda_type_text *asciiline;

        array = coda_type_array_new(coda_format_ascii);
        if (array == NULL)
        {
            return -1;
        }
        if (coda_type_array_add_fixed_dimension(array, product_file->num_asciilines) != 0)
        {
            coda_type_release((coda_type *)array);
            return -1;
        }
        asciiline = coda_type_text_new(coda_format_ascii);
        if (asciiline == NULL)
        {
            coda_type_release((coda_type *)array);
            return -1;
        }
        coda_type_text_set_special_text_type(asciiline, ascii_text_line_with_eol);
        if (coda_type_array_set_base_type(array, (coda_type *)asciiline) != 0)
        {
            coda_type_release((coda_type *)array);
            coda_type_release((coda_type *)asciiline);
            return -1;
        }

        product_file->asciilines = (coda_type *)array;
    }

    cursor->product = product;
    cursor->n = 1;
    cursor->stack[0].type = (coda_dynamic_type *)product_file->asciilines;
    cursor->stack[0].index = -1;        /* there is no index for the root of the product */
    cursor->stack[0].bit_offset = 0;
    return 0;
}